

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O1

void __thiscall ANSIFontWriter::WriteWidths(ANSIFontWriter *this,DictionaryContext *inFontContext)

{
  ObjectsContext *this_00;
  pointer ppVar1;
  FT_Pos inIntegerToken;
  ushort uVar2;
  pointer ppVar3;
  
  DictionaryContext::WriteKey(inFontContext,&scFirstChar_abi_cxx11_);
  DictionaryContext::WriteIntegerValue
            (inFontContext,
             (ulong)(((this->mCharactersVector).
                      super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second).mEncodedCharacter);
  DictionaryContext::WriteKey(inFontContext,&scLastChar_abi_cxx11_);
  DictionaryContext::WriteIntegerValue
            (inFontContext,
             (ulong)(this->mCharactersVector).
                    super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second.mEncodedCharacter);
  DictionaryContext::WriteKey(inFontContext,&scWidths_abi_cxx11_);
  ObjectsContext::StartArray(this->mObjectsContext);
  ppVar3 = (this->mCharactersVector).
           super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->mCharactersVector).
           super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar2 = (ppVar3->second).mEncodedCharacter; uVar2 <= ppVar1[-1].second.mEncodedCharacter;
      uVar2 = uVar2 + 1) {
    this_00 = this->mObjectsContext;
    if (uVar2 == (ppVar3->second).mEncodedCharacter) {
      inIntegerToken = FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar3->first);
      ObjectsContext::WriteInteger(this_00,inIntegerToken,eTokenSeparatorSpace);
      ppVar3 = ppVar3 + 1;
    }
    else {
      ObjectsContext::WriteInteger(this_00,0,eTokenSeparatorSpace);
    }
    ppVar1 = (this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
  ObjectsContext::EndLine(this->mObjectsContext);
  return;
}

Assistant:

void ANSIFontWriter::WriteWidths(DictionaryContext* inFontContext)
{

	// FirstChar
	inFontContext->WriteKey(scFirstChar);
	inFontContext->WriteIntegerValue((mCharactersVector.begin())->second.mEncodedCharacter);
	
    // LastChar
	inFontContext->WriteKey(scLastChar);
	inFontContext->WriteIntegerValue(mCharactersVector.back().second.mEncodedCharacter);

	// Widths
	inFontContext->WriteKey(scWidths);

	mObjectsContext->StartArray();
	
	UIntAndGlyphEncodingInfoVector::iterator itCharacters = mCharactersVector.begin();
	for(unsigned short i = itCharacters->second.mEncodedCharacter; i <= mCharactersVector.back().second.mEncodedCharacter; ++i)
	{
		if(itCharacters->second.mEncodedCharacter == i)
		{
			mObjectsContext->WriteInteger(mFontInfo->GetGlyphWidth(itCharacters->first));
			++itCharacters;
		}
		else
		{
			mObjectsContext->WriteInteger(0);
		}
	}
	mObjectsContext->EndArray();
	mObjectsContext->EndLine();

}